

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlTestReporter.cpp
# Opt level: O0

void __thiscall
UnitTest::XmlTestReporter::ReportSummary
          (XmlTestReporter *this,int totalTestCount,int failedTestCount,int failureCount,
          float secondsElapsed)

{
  ostream *poVar1;
  bool bVar2;
  reference pDVar3;
  pointer pDVar4;
  __normal_iterator<const_UnitTest::DeferredTestResult_*,_std::vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>_>
  local_38;
  __normal_iterator<const_UnitTest::DeferredTestResult_*,_std::vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>_>
  local_30;
  const_iterator i;
  DeferredTestResultList *results;
  float secondsElapsed_local;
  int failureCount_local;
  int failedTestCount_local;
  int totalTestCount_local;
  XmlTestReporter *this_local;
  
  AddXmlElement(this,this->m_ostream,(char *)0x0);
  BeginResults(this,this->m_ostream,totalTestCount,failedTestCount,failureCount,secondsElapsed);
  i._M_current = (DeferredTestResult *)
                 DeferredTestReporter::GetResults(&this->super_DeferredTestReporter);
  local_30._M_current =
       (DeferredTestResult *)
       std::vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>::
       begin((vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_> *)
             i._M_current);
  while( true ) {
    local_38._M_current =
         (DeferredTestResult *)
         std::vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>::
         end(i._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar2) break;
    poVar1 = this->m_ostream;
    pDVar3 = __gnu_cxx::
             __normal_iterator<const_UnitTest::DeferredTestResult_*,_std::vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>_>
             ::operator*(&local_30);
    BeginTest(this,poVar1,pDVar3);
    pDVar4 = __gnu_cxx::
             __normal_iterator<const_UnitTest::DeferredTestResult_*,_std::vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>_>
             ::operator->(&local_30);
    if ((pDVar4->failed & 1U) != 0) {
      poVar1 = this->m_ostream;
      pDVar3 = __gnu_cxx::
               __normal_iterator<const_UnitTest::DeferredTestResult_*,_std::vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>_>
               ::operator*(&local_30);
      AddFailure(this,poVar1,pDVar3);
    }
    poVar1 = this->m_ostream;
    pDVar3 = __gnu_cxx::
             __normal_iterator<const_UnitTest::DeferredTestResult_*,_std::vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>_>
             ::operator*(&local_30);
    EndTest(this,poVar1,pDVar3);
    __gnu_cxx::
    __normal_iterator<const_UnitTest::DeferredTestResult_*,_std::vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>_>
    ::operator++(&local_30);
  }
  EndResults(this,this->m_ostream);
  return;
}

Assistant:

void XmlTestReporter::ReportSummary(int totalTestCount, int failedTestCount,
                                    int failureCount, float secondsElapsed)
{
    AddXmlElement(m_ostream, NULL);

    BeginResults(m_ostream, totalTestCount, failedTestCount, failureCount, secondsElapsed);

    DeferredTestResultList const& results = GetResults();
    for (DeferredTestResultList::const_iterator i = results.begin(); i != results.end(); ++i)
    {
        BeginTest(m_ostream, *i);

        if (i->failed)
            AddFailure(m_ostream, *i);

        EndTest(m_ostream, *i);
    }

    EndResults(m_ostream);
}